

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O1

void __thiscall
dlib::image_dataset_metadata::doc_handler::characters(doc_handler *this,string *data)

{
  pointer pbVar1;
  int iVar2;
  char *in_RCX;
  char *trim_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pbVar1 = (this->ts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x40) &&
     (iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + 1)), iVar2 == 0)) {
    trim<char,std::char_traits<char>,std::allocator<char>>
              (&local_38,(dlib *)data,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",in_RCX
              );
    std::__cxx11::string::_M_assign((string *)&this->meta->name);
  }
  else {
    pbVar1 = (this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->ts).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x40) &&
       (iVar2 = std::__cxx11::string::compare((char *)(pbVar1 + 1)), iVar2 == 0)) {
      trim<char,std::char_traits<char>,std::allocator<char>>
                (&local_38,(dlib *)data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",
                 in_RCX);
      std::__cxx11::string::_M_assign((string *)&this->meta->comment);
    }
    else {
      pbVar1 = (this->ts).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      trim_chars = (char *)((long)(this->ts).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1);
      if (trim_chars < (char *)0x21) {
        return;
      }
      iVar2 = std::__cxx11::string::compare(trim_chars + (long)(pbVar1 + -1));
      if (iVar2 != 0) {
        return;
      }
      iVar2 = std::__cxx11::string::compare
                        ((char *)((this->ts).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -2));
      if (iVar2 != 0) {
        return;
      }
      trim<char,std::char_traits<char>,std::allocator<char>>
                (&local_38,(dlib *)data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",
                 trim_chars);
      std::__cxx11::string::_M_assign((string *)&(this->temp_box).label);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

virtual void characters ( 
                const std::string& data
            )
            {
                if (ts.size() == 2 && ts[1] == "name")
                {
                    meta.name = trim(data);
                }
                else if (ts.size() == 2 && ts[1] == "comment")
                {
                    meta.comment = trim(data);
                }
                else if (ts.size() >= 2 && ts[ts.size()-1] == "label" && 
                                           ts[ts.size()-2] == "box")
                {
                    temp_box.label = trim(data);
                }
            }